

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

int main(void)

{
  uint8_t *sk;
  undefined1 auVar1 [64];
  uint __line;
  undefined4 uVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *__assertion;
  size_t out_len;
  long lVar10;
  undefined1 auVar11 [64];
  uint8_t a [5];
  uint8_t uStack_2a53;
  uint8_t uStack_2a52;
  uint8_t uStack_2a51;
  undefined1 local_2a38 [32];
  hydro_hash_state st;
  uint8_t b [5];
  uint8_t y [100];
  uint8_t x [100];
  uint8_t dk_1 [32];
  undefined1 local_2838 [32];
  uint8_t subkey2 [16];
  uint8_t subkey1 [16];
  uint8_t subkey3 [32];
  undefined1 local_27a8 [32];
  uint8_t server_peer_pk [32];
  uint8_t client_peer_pk [32];
  char hex [201];
  
  iVar4 = hydro_init();
  if (iVar4 != 0) {
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1de,"int main(void)");
  }
  auVar11 = vpbroadcastb_avx512bw(ZEXT116(0xd0));
  builtin_memcpy(a,"\x01\x02\x03\x04\x05@",5);
  uVar2 = a._0_4_;
  _a = CONCAT44(stack0xffffffffffffd5ac,uVar2);
  builtin_memcpy(b,"\x01\x02\x03\x04\x05",5);
  auVar1 = vmovdqu64_avx512f(auVar11);
  x[0] = auVar1[0];
  x[1] = auVar1[1];
  x._2_6_ = auVar1._2_6_;
  x._8_8_ = auVar1._8_8_;
  x._16_8_ = auVar1._16_8_;
  x._24_8_ = auVar1._24_8_;
  x._32_4_ = auVar1._32_4_;
  auVar1 = vmovdqu64_avx512f(auVar11);
  x._36_28_ = auVar1._0_28_;
  x._64_35_ = auVar1._28_35_;
  x[99] = auVar1[0x3f];
  hydro_memzero(x,100);
  if (x[0] != '\0') {
    __assert_fail("x[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x90,"void test_core(void)");
  }
  if (x[99] != '\0') {
    __assert_fail("x[sizeof x - 1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x91,"void test_core(void)");
  }
  hydro_increment(x,100);
  if (x[0] != '\x01') {
    __assert_fail("x[0] == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x93,"void test_core(void)");
  }
  if (x[99] != '\0') {
    __assert_fail("x[sizeof x - 1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x94,"void test_core(void)");
  }
  x[0] = 0xff;
  hydro_increment(x,100);
  if (x[0] != '\0') {
    __assert_fail("x[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x97,"void test_core(void)");
  }
  if (x[1] != '\x01') {
    __assert_fail("x[1] == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x98,"void test_core(void)");
  }
  if (x[99] != '\0') {
    __assert_fail("x[sizeof x - 1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x99,"void test_core(void)");
  }
  _Var3 = hydro_equal(a,b,5);
  if (!_Var3) {
    __assert_fail("hydro_equal(a, b, sizeof a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9a,"void test_core(void)");
  }
  _Var3 = hydro_equal(a,a,5);
  if (_Var3) {
    __assert_fail("!hydro_equal(a, a, sizeof a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9b,"void test_core(void)");
  }
  iVar4 = hydro_compare(a,b,5);
  if (iVar4 != 0) {
    __assert_fail("hydro_compare(a, b, sizeof a) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9c,"void test_core(void)");
  }
  iVar4 = hydro_compare(a,a,5);
  if (iVar4 != 0) {
    __assert_fail("hydro_compare(a, a, sizeof a) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9d,"void test_core(void)");
  }
  a[0] = a[0] + '\x01';
  iVar4 = hydro_compare(a,b,5);
  if (iVar4 != 1) {
    __assert_fail("hydro_compare(a, b, sizeof a) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9f,"void test_core(void)");
  }
  iVar4 = hydro_compare(b,a,5);
  if (iVar4 != -1) {
    __assert_fail("hydro_compare(b, a, sizeof a) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa0,"void test_core(void)");
  }
  hydro_random_buf(x,100);
  pcVar6 = hydro_bin2hex(hex,0xc9,x,100);
  if (pcVar6 == (char *)0x0) {
    __assert_fail("hydro_bin2hex(hex, sizeof hex, x, sizeof x) != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa2,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(y,1,hex,0xc9,(char *)0x0,(char **)0x0);
  if (iVar4 != -1) {
    __assert_fail("hydro_hex2bin(y, 1, hex, sizeof hex, NULL, NULL) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa3,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(y,100,hex,0xc9,(char *)0x0,(char **)0x0);
  if (iVar4 != -1) {
    __assert_fail("hydro_hex2bin(y, sizeof y, hex, sizeof hex, NULL, NULL) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa4,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(y,100,hex,200,(char *)0x0,(char **)0x0);
  if (iVar4 != 100) {
    __assert_fail("hydro_hex2bin(y, sizeof y, hex, sizeof hex - 1, NULL, NULL) == sizeof x",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa5,"void test_core(void)");
  }
  _Var3 = hydro_equal(x,y,100);
  if (!_Var3) {
    __assert_fail("hydro_equal(x, y, sizeof x)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa6,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(x,100,"452a",4,(char *)0x0,(char **)0x0);
  if (iVar4 != 2) {
    __assert_fail("hydro_hex2bin(x, sizeof x, \"452a\", 4, NULL, NULL) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa7,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(y,100,"#452a#",6,"#",(char **)0x0);
  if (iVar4 != 2) {
    __assert_fail("hydro_hex2bin(y, sizeof y, \"#452a#\", 6, \"#\", NULL) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa8,"void test_core(void)");
  }
  _Var3 = hydro_equal(x,y,100);
  if (!_Var3) {
    __assert_fail("hydro_equal(x, y, sizeof x)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa9,"void test_core(void)");
  }
  builtin_strncpy(hex,"#452a",6);
  iVar4 = hydro_hex2bin(x,100,hex,0,(char *)0x0,(char **)&st);
  if (iVar4 != 0) {
    __assert_fail("hydro_hex2bin(x, sizeof x, hex, 0, NULL, &hexf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xab,"void test_core(void)");
  }
  if ((char *)st.state._0_8_ != hex) {
    __assert_fail("hexf == hex",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xac,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(x,100,hex,6,(char *)0x0,(char **)&st);
  if (iVar4 != 0) {
    __assert_fail("hydro_hex2bin(x, sizeof x, hex, sizeof \"#452a\", NULL, &hexf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xad,"void test_core(void)");
  }
  if ((char *)st.state._0_8_ != hex) {
    __assert_fail("hexf == hex",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xae,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(x,100,hex,6,"#",(char **)&st);
  if (iVar4 != 2) {
    __assert_fail("hydro_hex2bin(x, sizeof x, hex, sizeof \"#452a\", \"#\", &hexf) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xaf,"void test_core(void)");
  }
  if ((char *)st.state._0_8_ != hex + 6) {
    __assert_fail("hexf == hex + 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xb0,"void test_core(void)");
  }
  a[0] = '\0';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  a[4] = '\0';
  uStack_2a53 = '\0';
  uStack_2a52 = '\0';
  uStack_2a51 = '\0';
  hydro_random_buf_deterministic(b,0x20,a);
  hydro_increment(a,0x20);
  hydro_hash_init(&st,"libtests",b);
  for (out_len = 0; out_len != 0x3e9; out_len = out_len + 1) {
    hydro_random_buf_deterministic(hex,out_len,a);
    hydro_increment(a,0x20);
    hydro_hash_update(&st,hex,out_len);
  }
  hydro_hash_final(&st,y,100);
  hydro_bin2hex((char *)x,0xc9,y,100);
  iVar4 = streq("e5d2beb77a039965850ee76327e06b2fa6cb5121db8038b11bce4641a9c4bd843658104bdf07342570bb5fd1d72c0d31a8981b47c718fddaffbd4171605c873cbaf921bb57988dd814f3a3fbef9799ff7c762705c4bf37ab29815981bf0d8833d60afe14"
                ,(char *)x);
  if (iVar4 == 0) {
    __assertion = 
    "streq((\"e5d2beb77a039965850ee76327e06b2fa6cb5121db8038b11bce4641a9c4bd843658104bdf07342570bb5fd1d7\" \"2c0d31a8981b47c718fddaffbd4171605c873cbaf921bb57988dd814f3a3fbef9799ff7c762705c4bf37ab2981\" \"5981bf0d8833d60afe14\"), (hex))"
    ;
    pcVar6 = "void test_hash(void)";
    __line = 0x6c;
  }
  else {
    hydro_hash_hash(y,100,hex,1000,"libtests",b);
    hydro_bin2hex((char *)x,0xc9,y,100);
    iVar4 = streq("724bd8883df73320ffd70923cb997f9a99bc670c4d78887be4975add0099fbf489b266a85d1f56743062d60a05590cbce47e45108367879bf4641cbaefe584e8618cbeb8c230ae956da22c7c5c4f11a8804ca576ec20fa5da239dde3d03a6018383c21f5"
                  ,(char *)x);
    if (iVar4 == 0) {
      __assertion = 
      "streq((\"724bd8883df73320ffd70923cb997f9a99bc670c4d78887be4975add0099fbf489b266a85d1f56743062d60a05\" \"590cbce47e45108367879bf4641cbaefe584e8618cbeb8c230ae956da22c7c5c4f11a8804ca576ec20fa5da239\" \"dde3d03a6018383c21f5\"), (hex))"
      ;
      pcVar6 = "void test_hash(void)";
      __line = 0x75;
    }
    else {
      hydro_hash_hash(y,0x20,hex,1000,"libtests",b);
      hydro_bin2hex((char *)x,0xc9,y,0x20);
      iVar4 = streq("7dfa45ce18210e2422fd658bf7beccb6e534e44f99ae359f4af3ba41af8ca463",(char *)x);
      if (iVar4 == 0) {
        __assertion = 
        "streq((\"7dfa45ce18210e2422fd658bf7beccb6e534e44f99ae359f4af3ba41af8ca463\"), (hex))";
        pcVar6 = "void test_hash(void)";
        __line = 0x7a;
      }
      else {
        hydro_hash_hash(y,0x20,hex,0xd,"libtests",b);
        hydro_bin2hex((char *)x,0xc9,y,0x20);
        iVar4 = streq("d57a9800549bb4bab6a06fa6e16e08aad68d7d4313fb69a81b9f5d5af375dbe7",(char *)x);
        if (iVar4 == 0) {
          __assert_fail("streq((\"d57a9800549bb4bab6a06fa6e16e08aad68d7d4313fb69a81b9f5d5af375dbe7\"), (hex))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x80,"void test_hash(void)");
        }
        dk_1[0] = '\0';
        dk_1[1] = '\0';
        dk_1[2] = '\0';
        dk_1[3] = '\0';
        dk_1[4] = '\0';
        dk_1[5] = '\0';
        dk_1[6] = '\0';
        dk_1[7] = '\0';
        dk_1[8] = '\0';
        dk_1[9] = '\0';
        dk_1[10] = '\0';
        dk_1[0xb] = '\0';
        dk_1[0xc] = '\0';
        dk_1[0xd] = '\0';
        dk_1[0xe] = '\0';
        dk_1[0xf] = '\0';
        dk_1[0x10] = '\0';
        dk_1[0x11] = '\0';
        dk_1[0x12] = '\0';
        dk_1[0x13] = '\0';
        dk_1[0x14] = '\0';
        dk_1[0x15] = '\0';
        dk_1[0x16] = '\0';
        dk_1[0x17] = '\0';
        dk_1[0x18] = '\0';
        dk_1[0x19] = '\0';
        dk_1[0x1a] = '\0';
        dk_1[0x1b] = '\0';
        dk_1[0x1c] = '\0';
        dk_1[0x1d] = '\0';
        dk_1[0x1e] = '\0';
        dk_1[0x1f] = '\0';
        hydro_random_buf_deterministic(b,0x20,dk_1);
        hydro_kdf_derive_from_key(subkey1,0x10,1,"libtests",b);
        hydro_kdf_derive_from_key(subkey2,0x10,2,"libtests",b);
        hydro_kdf_derive_from_key(subkey3,0x20,0,"libtests",b);
        hydro_kdf_derive_from_key(y,0x32,0,"libtests",b);
        hydro_bin2hex((char *)&st,0x21,subkey1,0x10);
        hydro_bin2hex((char *)a,0x21,subkey2,0x10);
        hydro_bin2hex((char *)x,0x41,subkey3,0x20);
        hydro_bin2hex(hex,0x65,y,0x32);
        iVar4 = streq("af8019d3516d4ba6c80a7ea5a87e4d77",(char *)&st);
        if (iVar4 == 0) {
          __assert_fail("streq((\"af8019d3516d4ba6c80a7ea5a87e4d77\"), (subkey1_hex))",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0xf3,"void test_kdf(void)");
        }
        iVar4 = streq("af8c4cba4e1f36c293631cc7001717dd",(char *)a);
        if (iVar4 == 0) {
          __assert_fail("streq((\"af8c4cba4e1f36c293631cc7001717dd\"), (subkey2_hex))",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0xf4,"void test_kdf(void)");
        }
        iVar4 = streq("ff9345489dea1e4fe59194cea8794c9b0af9380c2d18c3ab38eeef2af95c1e26",(char *)x);
        if (iVar4 == 0) {
          __assert_fail("streq((\"ff9345489dea1e4fe59194cea8794c9b0af9380c2d18c3ab38eeef2af95c1e26\"), (subkey3_hex))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0xf5,"void test_kdf(void)");
        }
        iVar4 = streq("a8dd79ca19d604d1487b82d76b8d4ad4138a29dfaeeb207b99b2e5904e7855555bb94a76070fa71871df6ed911661d99efec"
                      ,hex);
        if (iVar4 == 0) {
          __assert_fail("streq((\"a8dd79ca19d604d1487b82d76b8d4ad4138a29dfaeeb207b99b2e5904e7855555bb94a76070fa71871df6ed911\" \"661d99efec\"), (subkey4_hex))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0xf9,"void test_kdf(void)");
        }
        hydro_kx_keygen((hydro_kx_keypair *)hex);
        hydro_random_buf(a,0x20);
        hydro_kx_n_1((hydro_kx_session_keypair *)x,(uint8_t *)&st,a,(uint8_t *)hex);
        hydro_kx_n_2((hydro_kx_session_keypair *)y,(uint8_t *)&st,a,(hydro_kx_keypair *)hex);
        _Var3 = hydro_equal(x + 0x20,(hydro_kx_session_keypair *)y,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x140,"void test_kx_n(void)");
        }
        _Var3 = hydro_equal(x,y + 0x20,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x141,"void test_kx_n(void)");
        }
        hydro_kx_keygen((hydro_kx_keypair *)x);
        hydro_kx_keygen((hydro_kx_keypair *)y);
        hydro_kx_kk_1((hydro_kx_state *)hex,b,y,(hydro_kx_keypair *)x);
        hydro_kx_kk_2((hydro_kx_session_keypair *)a,dk_1,b,x,(hydro_kx_keypair *)y);
        hydro_kx_kk_3((hydro_kx_state *)hex,(hydro_kx_session_keypair *)&st,dk_1,
                      (hydro_kx_keypair *)x);
        _Var3 = hydro_equal(st.state + 8,(hydro_kx_session_keypair *)a,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x156,"void test_kx_kk(void)");
        }
        _Var3 = hydro_equal((hydro_kx_keypair *)&st,local_2a38,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x157,"void test_kx_kk(void)");
        }
        hydro_kx_keygen((hydro_kx_keypair *)&st);
        hydro_kx_keygen((hydro_kx_keypair *)a);
        hydro_kx_xx_1((hydro_kx_state *)hex,subkey1,(uint8_t *)0x0);
        hydro_kx_xx_2((hydro_kx_state *)x,y,subkey1,(uint8_t *)0x0,(hydro_kx_keypair *)a);
        hydro_kx_xx_3((hydro_kx_state *)hex,(hydro_kx_session_keypair *)dk_1,b,(uint8_t *)0x0,y,
                      (uint8_t *)0x0,(hydro_kx_keypair *)&st);
        hydro_kx_xx_4((hydro_kx_state *)x,(hydro_kx_session_keypair *)subkey3,(uint8_t *)0x0,b,
                      (uint8_t *)0x0);
        _Var3 = hydro_equal(local_2838,(hydro_kx_session_keypair *)subkey3,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x172,"void test_kx_xx(void)");
        }
        _Var3 = hydro_equal(dk_1,local_27a8,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x173,"void test_kx_xx(void)");
        }
        hydro_random_buf(subkey2,0x20);
        hydro_kx_xx_1((hydro_kx_state *)hex,subkey1,subkey2);
        hydro_kx_xx_2((hydro_kx_state *)x,y,subkey1,subkey2,(hydro_kx_keypair *)a);
        hydro_kx_xx_3((hydro_kx_state *)hex,(hydro_kx_session_keypair *)dk_1,b,client_peer_pk,y,
                      subkey2,(hydro_kx_keypair *)&st);
        hydro_kx_xx_4((hydro_kx_state *)x,(hydro_kx_session_keypair *)subkey3,server_peer_pk,b,
                      subkey2);
        _Var3 = hydro_equal(local_2838,(hydro_kx_session_keypair *)subkey3,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x17b,"void test_kx_xx(void)");
        }
        _Var3 = hydro_equal(dk_1,local_27a8,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x17c,"void test_kx_xx(void)");
        }
        _Var3 = hydro_equal(client_peer_pk,a,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(client_peer_pk, server_static_kp.pk, hydro_kx_PUBLICKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x17d,"void test_kx_xx(void)");
        }
        _Var3 = hydro_equal(server_peer_pk,&st,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(server_peer_pk, client_static_kp.pk, hydro_kx_PUBLICKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x17e,"void test_kx_xx(void)");
        }
        hydro_kx_keygen((hydro_kx_keypair *)x);
        hydro_kx_nk_1((hydro_kx_state *)hex,a,(uint8_t *)0x0,x);
        hydro_kx_nk_2((hydro_kx_session_keypair *)&st,b,a,(uint8_t *)0x0,(hydro_kx_keypair *)x);
        hydro_kx_nk_3((hydro_kx_state *)hex,(hydro_kx_session_keypair *)y,b);
        _Var3 = hydro_equal(y + 0x20,(hydro_kx_session_keypair *)&st,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x192,"void test_kx_nk(void)");
        }
        _Var3 = hydro_equal(y,st.state + 8,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x193,"void test_kx_nk(void)");
        }
        hydro_random_buf(dk_1,0x20);
        hydro_kx_nk_1((hydro_kx_state *)hex,a,dk_1,x);
        hydro_kx_nk_2((hydro_kx_session_keypair *)&st,b,a,dk_1,(hydro_kx_keypair *)x);
        hydro_kx_nk_3((hydro_kx_state *)hex,(hydro_kx_session_keypair *)y,b);
        _Var3 = hydro_equal(y + 0x20,(hydro_kx_session_keypair *)&st,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x19b,"void test_kx_nk(void)");
        }
        _Var3 = hydro_equal(y,st.state + 8,0x20);
        if (!_Var3) {
          __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x19c,"void test_kx_nk(void)");
        }
        builtin_memcpy(a,"xxxxx",5);
        uStack_2a53 = 'x';
        uStack_2a52 = 'x';
        uStack_2a51 = 'x';
        hydro_pwhash_deterministic(y,0x40,"test",4,"libtests",a,1000,0,'\x01');
        hydro_bin2hex(hex,0x81,y,0x40);
        iVar4 = streq("2f1a804a02f25066fd0688bf8b8e03dff3a3866958a9cf5883c459e602e232d38e3e488723f0b4a2bc61d20cb36a04a4d2eb18be99bc61870d72d7de5d67f237"
                      ,hex);
        if (iVar4 == 0) {
          __assert_fail("streq((\"2f1a804a02f25066fd0688bf8b8e03dff3a3866958a9cf5883c459e602e232d38e3e488723f0b4a2bc61d2\" \"0cb36a04a4d2eb18be99bc61870d72d7de5d67f237\"), (h_hex))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1b1,"void test_pwhash(void)");
        }
        hydro_pwhash_keygen(a);
        iVar4 = hydro_pwhash_create(x,"test",4,a,1000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_create(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1b5,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,a,1000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1b6,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,a,2000,10,'\n');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops * 2, 10, 10) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1b8,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,a,500,10,'\n');
        if (iVar4 != -1) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops / 2, 10, 10) == -1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1ba,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"Test",4,a,1000,0,'\x01');
        if (iVar4 != -1) {
          __assert_fail("hydro_pwhash_verify(stored, \"Test\", sizeof \"Test\" - 1, master_key, ops, 0, 1) == -1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1bb,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",3,a,1000,0,'\x01');
        if (iVar4 != -1) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"tes\" - 1, master_key, ops, 0, 1) == -1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1bc,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_derive_static_key
                          ((uint8_t *)&st,0x40,x,"test",4,"libtests",a,1000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, \"test\", sizeof \"test\" - 1, ctx, master_key, ops, 0, 1) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1bf,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_derive_static_key
                          ((uint8_t *)&st,0x40,x,"Test",4,"libtests",a,1000,0,'\x01');
        if (iVar4 != -1) {
          __assert_fail("hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, \"Test\", sizeof \"Test\" - 1, ctx, master_key, ops, 0, 1) == -1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1c1,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_reencrypt(x,a,a);
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_reencrypt(stored, master_key, master_key) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1c3,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,a,1000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1c4,"void test_pwhash(void)");
        }
        hydro_pwhash_keygen(b);
        iVar4 = hydro_pwhash_reencrypt(x,a,b);
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_reencrypt(stored, master_key, new_master_key) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1c6,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,a,1000,0,'\x01');
        if (iVar4 != -1) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == -1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1c7,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,b,1000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops, 0, 1) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1c8,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_upgrade(x,b,2000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_upgrade(stored, new_master_key, ops * 2, 0, 1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1ca,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,b,1000,0,'\x01');
        if (iVar4 != -1) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops, 0, 1) == -1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1cb,"void test_pwhash(void)");
        }
        iVar4 = hydro_pwhash_verify(x,"test",4,b,2000,0,'\x01');
        if (iVar4 != 0) {
          __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops * 2, 0, 1) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                        ,0x1cd,"void test_pwhash(void)");
        }
        lVar8 = 0;
        for (lVar10 = 0; lVar10 != 10000; lVar10 = lVar10 + 1) {
          uVar5 = hydro_random_u32();
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            lVar8 = lVar8 + (ulong)((uVar5 >> ((uint)lVar7 & 0x1f) & 1) != 0);
          }
        }
        if (lVar8 - 0x4651U < 3999) {
          hydro_random_buf(hex,10000);
          lVar8 = 0;
          for (lVar10 = 0; lVar10 != 10000; lVar10 = lVar10 + 1) {
            lVar8 = lVar8 + (ulong)((byte)hex[lVar10] & 1);
          }
          if (lVar8 - 0x1195U < 999) {
            x[0] = (uint8_t)hex._0_4_;
            x[1] = SUB41(hex._0_4_,1);
            x._2_6_ = (undefined6)(CONCAT26(hex._6_2_,CONCAT24(hex._4_2_,hex._0_4_)) >> 0x10);
            x[8] = hex[8];
            x[9] = hex[9];
            x[10] = hex[10];
            x[0xb] = hex[0xb];
            x[0xc] = hex[0xc];
            x[0xd] = hex[0xd];
            x[0xe] = hex[0xe];
            x[0xf] = hex[0xf];
            x[0x10] = hex[0x10];
            x[0x11] = hex[0x11];
            x[0x12] = hex[0x12];
            x[0x13] = hex[0x13];
            x[0x14] = hex[0x14];
            x[0x15] = hex[0x15];
            x[0x16] = hex[0x16];
            x[0x17] = hex[0x17];
            x[0x18] = hex[0x18];
            x[0x19] = hex[0x19];
            x[0x1a] = hex[0x1a];
            x[0x1b] = hex[0x1b];
            x[0x1c] = hex[0x1c];
            x[0x1d] = hex[0x1d];
            x[0x1e] = hex[0x1e];
            x[0x1f] = hex[0x1f];
            hydro_random_buf_deterministic(hex,10000,x);
            lVar10 = 0;
            for (lVar8 = 0; lVar8 != 10000; lVar8 = lVar8 + 1) {
              lVar10 = lVar10 + (ulong)((byte)hex[lVar8] & 1);
            }
            if (lVar10 - 0x1195U < 999) {
              hydro_random_buf_deterministic(hex,10000,x);
              lVar8 = 0;
              for (lVar7 = 0; lVar7 != 10000; lVar7 = lVar7 + 1) {
                lVar8 = lVar8 + (ulong)((byte)hex[lVar7] & 1);
              }
              if (lVar8 == lVar10) {
                lVar8 = 0;
                do {
                  if (lVar8 == 1000) {
                    y[0] = '\0';
                    y[1] = '\0';
                    y[2] = '\0';
                    y[3] = '\0';
                    y[4] = '\0';
                    y[5] = '\0';
                    y[6] = '\0';
                    y[7] = '\0';
                    y[8] = '\0';
                    y[9] = '\0';
                    y[10] = '\0';
                    y[0xb] = '\0';
                    y[0xc] = '\0';
                    y[0xd] = '\0';
                    y[0xe] = '\0';
                    y[0xf] = '\0';
                    y[0x10] = '\0';
                    y[0x11] = '\0';
                    y[0x12] = '\0';
                    y[0x13] = '\0';
                    y[0x14] = '\0';
                    y[0x15] = '\0';
                    y[0x16] = '\0';
                    y[0x17] = '\0';
                    y[0x18] = '\0';
                    y[0x19] = '\0';
                    y[0x1a] = '\0';
                    y[0x1b] = '\0';
                    y[0x1c] = '\0';
                    y[0x1d] = '\0';
                    y[0x1e] = '\0';
                    y[0x1f] = '\0';
                    hydro_random_buf_deterministic(&st,0x19,y);
                    hydro_increment(y,0x20);
                    hydro_random_buf_deterministic(x,0x20,y);
                    hydro_increment(y,0x20);
                    hydro_secretbox_encrypt((uint8_t *)hex,&st,0x19,0,"libtests",x);
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,0x3d,0,"libtests",x);
                    if (iVar4 != 0) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 0, ctx, key) == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xc3,"void test_secretbox(void)");
                    }
                    _Var3 = hydro_equal(&st,a,0x19);
                    if (!_Var3) {
                      __assert_fail("hydro_equal(m, m2, sizeof m)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xc4,"void test_secretbox(void)");
                    }
                    hydro_secretbox_probe_create(b,(uint8_t *)hex,0x3d,"libtests",x);
                    iVar4 = hydro_secretbox_probe_verify(b,(uint8_t *)hex,0x3d,"libtests",x);
                    if (iVar4 != 0) {
                      __assert_fail("hydro_secretbox_probe_verify(probe, c, sizeof c, ctx, key) == 0"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,199,"void test_secretbox(void)");
                    }
                    b[0] = b[0] + '\x01';
                    iVar4 = hydro_secretbox_probe_verify(b,(uint8_t *)hex,0x3d,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_probe_verify(probe, c, sizeof c, ctx, key) == -1"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xc9,"void test_secretbox(void)");
                    }
                    b[0] = b[0] + 0xff;
                    x[0] = x[0] + '\x01';
                    iVar4 = hydro_secretbox_probe_verify(b,(uint8_t *)hex,0x3d,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_probe_verify(probe, c, sizeof c, ctx, key) == -1"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xcc,"void test_secretbox(void)");
                    }
                    x[0] = x[0] + 0xff;
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,0,0,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, 0, 0, ctx, key) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xcf,"void test_secretbox(void)");
                    }
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,1,0,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, 1, 0, ctx, key) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xd0,"void test_secretbox(void)");
                    }
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,0x24,0,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, hydro_secretbox_HEADERBYTES, 0, ctx, key) == -1"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xd1,"void test_secretbox(void)");
                    }
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,0x3d,1,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 1, ctx, key) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xd2,"void test_secretbox(void)");
                    }
                    _Var3 = hydro_equal(&st,a,0x19);
                    if (_Var3) {
                      __assert_fail("!hydro_equal(m, m2, sizeof m)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xd3,"void test_secretbox(void)");
                    }
                    x[0] = x[0] + '\x01';
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,0x3d,0,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 0, ctx, key) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xd5,"void test_secretbox(void)");
                    }
                    x[0] = x[0] + 0xff;
                    uVar5 = hydro_random_uniform(0x3d);
                    hex[uVar5] = hex[uVar5] + '\x01';
                    iVar4 = hydro_secretbox_decrypt(a,(uint8_t *)hex,0x3d,0,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 0, ctx, key) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0xd8,"void test_secretbox(void)");
                    }
                    hydro_random_buf(hex,500);
                    hydro_sign_keygen((hydro_sign_keypair *)x);
                    sk = x + 0x20;
                    hydro_sign_create(y,hex,500,"libtests",sk);
                    iVar4 = hydro_sign_verify(y,hex,500,"libtests",x);
                    if (iVar4 != 0) {
                      __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0x10b,"void test_sign(void)");
                    }
                    y[0] = y[0] + '\x01';
                    iVar4 = hydro_sign_verify(y,hex,500,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0x10d,"void test_sign(void)");
                    }
                    y[0] = y[0] + 0xff;
                    y[0x3f] = y[0x3f] + '\x01';
                    iVar4 = hydro_sign_verify(y,hex,500,"libtests",x);
                    if (iVar4 != -1) {
                      __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0x110,"void test_sign(void)");
                    }
                    y[0x3f] = y[0x3f] + 0xff;
                    hex[0] = hex[0] + '\x01';
                    iVar4 = hydro_sign_verify(y,hex,500,"libtests",x);
                    if (iVar4 == -1) {
                      hex[0] = hex[0] + '\x01';
                      hydro_sign_create(y,hex,500,"libtests",sk);
                      hydro_sign_init((hydro_sign_state *)&st,"libtests");
                      hydro_sign_update((hydro_sign_state *)&st,hex,0xa6);
                      pcVar6 = hex + 0xa6;
                      hydro_sign_update((hydro_sign_state *)&st,pcVar6,0x14e);
                      iVar4 = hydro_sign_final_verify((hydro_sign_state *)&st,y,x);
                      if (iVar4 != 0) {
                        __assert_fail("hydro_sign_final_verify(&st, sig, kp.pk) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                      ,0x11a,"void test_sign(void)");
                      }
                      hydro_sign_init((hydro_sign_state *)&st,"libtests");
                      hydro_sign_update((hydro_sign_state *)&st,hex,0xa6);
                      hydro_sign_update((hydro_sign_state *)&st,pcVar6,0x14e);
                      hydro_sign_final_create((hydro_sign_state *)&st,y,sk);
                      hydro_sign_init((hydro_sign_state *)&st,"libtests");
                      hydro_sign_update((hydro_sign_state *)&st,hex,0xa6);
                      hydro_sign_update((hydro_sign_state *)&st,pcVar6,0x14e);
                      iVar4 = hydro_sign_final_verify((hydro_sign_state *)&st,y,x);
                      if (iVar4 != 0) {
                        __assert_fail("hydro_sign_final_verify(&st, sig, kp.pk) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                      ,0x124,"void test_sign(void)");
                      }
                      hydro_sign_init((hydro_sign_state *)&st,"libtests");
                      hydro_sign_update((hydro_sign_state *)&st,hex,0xa6);
                      hydro_sign_update((hydro_sign_state *)&st,pcVar6,0x14e);
                      y[0] = y[0] + '\x01';
                      iVar4 = hydro_sign_final_verify((hydro_sign_state *)&st,y,x);
                      if (iVar4 != -1) {
                        __assert_fail("hydro_sign_final_verify(&st, sig, kp.pk) == -1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                      ,0x12a,"void test_sign(void)");
                      }
                      hydro_sign_create(y,hex,0,"libtests",sk);
                      iVar4 = hydro_sign_verify(y,hex,500,"libtests",x);
                      if (iVar4 == -1) {
                        iVar4 = hydro_sign_verify(y,hex,0,"libtests",x);
                        if (iVar4 == 0) {
                          return 0;
                        }
                        __assert_fail("hydro_sign_verify(sig, msg, 0, ctx, kp.pk) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                      ,0x12e,"void test_sign(void)");
                      }
                      __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                    ,0x12d,"void test_sign(void)");
                    }
                    __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                                  ,0x113,"void test_sign(void)");
                  }
                  uVar9 = 0;
                  while (uVar9 != 99) {
                    uVar9 = uVar9 + 1;
                    uVar5 = hydro_random_uniform((uint32_t)uVar9);
                    if (uVar9 <= uVar5) {
                      __assertion = "x < j";
                      pcVar6 = "void test_randombytes(void)";
                      __line = 0x48;
                      goto LAB_001038a3;
                    }
                  }
                  lVar8 = lVar8 + 1;
                } while( true );
              }
              __assertion = "b == bp";
              pcVar6 = "void test_randombytes(void)";
              __line = 0x43;
            }
            else {
              __assertion = "b > 4500 && b < 5500";
              pcVar6 = "void test_randombytes(void)";
              __line = 0x3a;
            }
          }
          else {
            __assertion = "b > 4500 && b < 5500";
            pcVar6 = "void test_randombytes(void)";
            __line = 0x30;
          }
        }
        else {
          __assertion = "b > 18000 && b < 22000";
          pcVar6 = "void test_randombytes(void)";
          __line = 0x27;
        }
      }
    }
  }
LAB_001038a3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                ,__line,pcVar6);
}

Assistant:

int
main(void)
{
#ifdef _MSC_VER
    /*
     * On Windows, disable the "Abort - Retry - Ignore" GUI dialog that otherwise pops up on
     * assertion failure.
     */
    _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif

    int ret;

    ret = hydro_init();
    assert(ret == 0);

    test_core();
    test_hash();
    test_kdf();
    test_kx_n();
    test_kx_kk();
    test_kx_xx();
    test_kx_nk();
    test_pwhash();
    test_randombytes();
    test_secretbox();
    test_sign();

    return 0;
}